

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O0

REF_STATUS
mask_strong_bc_adjoint
          (REF_GRID_conflict ref_grid,REF_DICT ref_dict_bcs,REF_INT ldim,REF_DBL *prim_dual)

{
  REF_BOOL *replace_00;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL *replace;
  REF_DBL *prim_dual_local;
  REF_INT ldim_local;
  REF_DICT ref_dict_bcs_local;
  REF_GRID_conflict ref_grid_local;
  
  if (ldim * ref_grid->node->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xbaa,"mask_strong_bc_adjoint","malloc replace of REF_BOOL negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    replace_00 = (REF_BOOL *)malloc((long)(ldim * ref_grid->node->max) << 2);
    if (replace_00 == (REF_BOOL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0xbaa,"mask_strong_bc_adjoint","malloc replace of REF_BOOL NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      ref_grid_local._4_4_ = ref_phys_mask_strong_bcs(ref_grid,ref_dict_bcs,replace_00,ldim);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = ref_recon_extrapolate_kexact(ref_grid,prim_dual,replace_00,ldim);
        if (ref_grid_local._4_4_ == 0) {
          if (replace_00 != (REF_BOOL *)0x0) {
            free(replace_00);
          }
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0xbad,"mask_strong_bc_adjoint",(ulong)ref_grid_local._4_4_,"extrapolate kexact");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0xbab,"mask_strong_bc_adjoint",(ulong)ref_grid_local._4_4_,"mask");
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

static REF_STATUS mask_strong_bc_adjoint(REF_GRID ref_grid,
                                         REF_DICT ref_dict_bcs, REF_INT ldim,
                                         REF_DBL *prim_dual) {
  REF_BOOL *replace;
  ref_malloc(replace, ldim * ref_node_max(ref_grid_node(ref_grid)), REF_BOOL);
  RSS(ref_phys_mask_strong_bcs(ref_grid, ref_dict_bcs, replace, ldim), "mask");
  RSS(ref_recon_extrapolate_kexact(ref_grid, prim_dual, replace, ldim),
      "extrapolate kexact");
  ref_free(replace);

  return REF_SUCCESS;
}